

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dstr.c
# Opt level: O2

void setup_append_buf(arg_dstr_t ds,int new_space)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t size;
  char *__dest;
  
  pcVar3 = ds->data;
  __dest = ds->append_data;
  if (pcVar3 == __dest) {
    iVar1 = ds->append_used;
    if (pcVar3[iVar1] == '\0') goto LAB_00106763;
  }
  else if (500 < ds->append_data_size) {
    argtable3_xfree(__dest);
    ds->append_data = (char *)0x0;
    ds->append_data_size = 0;
    pcVar3 = ds->data;
    __dest = (char *)0x0;
  }
  sVar2 = strlen(pcVar3);
  iVar1 = (int)sVar2;
  ds->append_used = iVar1;
LAB_00106763:
  iVar1 = iVar1 + new_space;
  if (iVar1 < ds->append_data_size) {
    if (pcVar3 != __dest) {
      strcpy(__dest,pcVar3);
    }
  }
  else {
    size = 200;
    if (99 < iVar1) {
      size = (size_t)(uint)(iVar1 * 2);
    }
    pcVar3 = (char *)argtable3_xmalloc(size);
    memset(pcVar3,0,size);
    strcpy(pcVar3,ds->data);
    if (ds->append_data != (char *)0x0) {
      argtable3_xfree(ds->append_data);
    }
    ds->append_data = pcVar3;
    ds->append_data_size = (int)size;
  }
  arg_dstr_free(ds);
  ds->data = ds->append_data;
  return;
}

Assistant:

static void setup_append_buf(arg_dstr_t ds, int new_space) {
    int total_space;

    /*
     * Make the append buffer larger, if that's necessary, then copy the
     * data into the append buffer and make the append buffer the official
     * data.
     */
    if (ds->data != ds->append_data) {
        /*
         * If the buffer is too big, then free it up so we go back to a
         * smaller buffer. This avoids tying up memory forever after a large
         * operation.
         */
        if (ds->append_data_size > 500) {
            xfree(ds->append_data);
            ds->append_data = NULL;
            ds->append_data_size = 0;
        }
        ds->append_used = (int)strlen(ds->data);
    } else if (ds->data[ds->append_used] != 0) {
        /*
         * Most likely someone has modified a result created by
         * arg_dstr_cat et al. so that it has a different size. Just
         * recompute the size.
         */
        ds->append_used = (int)strlen(ds->data);
    }

    total_space = new_space + ds->append_used;
    if (total_space >= ds->append_data_size) {
        char* newbuf;

        if (total_space < 100) {
            total_space = 200;
        } else {
            total_space *= 2;
        }
        newbuf = (char*)xmalloc((unsigned)total_space);
        memset(newbuf, 0, (size_t)total_space);
        strcpy(newbuf, ds->data);
        if (ds->append_data != NULL) {
            xfree(ds->append_data);
        }
        ds->append_data = newbuf;
        ds->append_data_size = total_space;
    } else if (ds->data != ds->append_data) {
        strcpy(ds->append_data, ds->data);
    }

    arg_dstr_free(ds);
    ds->data = ds->append_data;
}